

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log.c
# Opt level: O0

int apply_to_counts_zz(hdr_histogram *h,uint8_t *counts_data,int32_t data_limit)

{
  bool bVar1;
  int iVar2;
  int64_t zeros;
  int64_t value;
  long lStack_30;
  int32_t counts_index;
  int64_t data_index;
  uint8_t *puStack_20;
  int32_t data_limit_local;
  uint8_t *counts_data_local;
  hdr_histogram *h_local;
  
  lStack_30 = 0;
  value._4_4_ = 0;
  data_index._4_4_ = data_limit;
  puStack_20 = counts_data;
  counts_data_local = (uint8_t *)h;
  while( true ) {
    bVar1 = false;
    if (lStack_30 < data_index._4_4_) {
      bVar1 = value._4_4_ < *(int *)(counts_data_local + 0x50);
    }
    if (!bVar1) break;
    iVar2 = zig_zag_decode_i64(puStack_20 + lStack_30,&zeros);
    lStack_30 = iVar2 + lStack_30;
    if (zeros < 0) {
      if ((zeros < -0x7fffffff) ||
         ((long)*(int *)(counts_data_local + 0x50) < (long)value._4_4_ + -zeros)) {
        return -0x7528;
      }
      value._4_4_ = (int)-zeros + value._4_4_;
    }
    else {
      *(int64_t *)(*(long *)(counts_data_local + 0x60) + (long)value._4_4_ * 8) = zeros;
      value._4_4_ = value._4_4_ + 1;
    }
  }
  if (data_index._4_4_ < lStack_30) {
    return -0x7527;
  }
  if (lStack_30 < data_index._4_4_) {
    return -0x7526;
  }
  return 0;
}

Assistant:

static int apply_to_counts_zz(struct hdr_histogram* h, const uint8_t* counts_data, const int32_t data_limit)
{
    int64_t data_index = 0;
    int32_t counts_index = 0;
    int64_t value;

    while (data_index < data_limit && counts_index < h->counts_len)
    {
        data_index += zig_zag_decode_i64(&counts_data[data_index], &value);

        if (value < 0)
        {
            int64_t zeros = -value;

            if (value <= INT32_MIN || counts_index + zeros > h->counts_len)
            {
                return HDR_TRAILING_ZEROS_INVALID;
            }

            counts_index += (int32_t) zeros;
        }
        else
        {
            h->counts[counts_index] = value;
            counts_index++;
        }
    }

    if (data_index > data_limit)
    {
        return HDR_VALUE_TRUNCATED;
    }
    else if (data_index < data_limit)
    {
        return HDR_ENCODED_INPUT_TOO_LONG;
    }

    return 0;
}